

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

void __thiscall jsonnet::internal::Unparser::unparse(Unparser *this,AST *ast_,bool space_before)

{
  int iVar1;
  undefined8 *puVar2;
  int *piVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  AST *pAVar6;
  long lVar7;
  ostream *poVar8;
  uint extraout_EDX;
  BinaryOp bop;
  long lVar9;
  Identifier *id;
  ulong uVar10;
  Identifier *id_00;
  Identifier *id_01;
  Identifier *id_02;
  Identifier *id_03;
  bool bVar11;
  Field *field;
  int *piVar12;
  char *pcVar13;
  char32_t *pcVar14;
  long lVar15;
  pointer *ppFVar16;
  Element *element;
  undefined8 *puVar17;
  Fodder *pFVar18;
  bool bVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  string local_58;
  long local_38;
  
LAB_001f8bc8:
  while( true ) {
    while( true ) {
      pAVar6 = left_recursive(ast_);
      bVar11 = (bool)(space_before & 1);
      fodder_fill(this->o,&ast_->openFodder,bVar11,pAVar6 == (AST *)0x0,false);
      if (ast_ == (AST *)0x0) {
        auVar20._4_8_ = 0;
        auVar20._0_4_ = extraout_EDX;
        auVar20 = auVar20 << 0x40;
      }
      else {
        auVar20 = __dynamic_cast(ast_,&AST::typeinfo,&Apply::typeinfo);
      }
      lVar7 = auVar20._0_8_;
      if (lVar7 != 0) {
        unparse(this,*(AST **)(lVar7 + 0x80),bVar11);
        fodder_fill(this->o,(Fodder *)(lVar7 + 0x88),false,false,false);
        std::__ostream_insert<char,std::char_traits<char>>(this->o,"(",1);
        lVar9 = *(long *)(lVar7 + 0xa8);
        if (*(long *)(lVar7 + 0xa0) != lVar9) {
          bVar11 = true;
          ppFVar16 = (pointer *)(*(long *)(lVar7 + 0xa0) + 0x40);
          do {
            if (!bVar11) {
              local_58._M_dataplus._M_p._0_1_ = 0x2c;
              std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_58,1);
            }
            bVar11 = (bool)(bVar11 ^ 1);
            if (ppFVar16[-5] != (pointer)0x0) {
              fodder_fill(this->o,(Fodder *)(ppFVar16 + -8),bVar11,true,false);
              poVar8 = this->o;
              unparse_id_abi_cxx11_(&local_58,(internal *)ppFVar16[-5],id);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,local_58._M_dataplus._M_p,local_58._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,
                                CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                         local_58.field_2._M_local_buf[0]) + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>(this->o,"=",1);
              bVar11 = false;
            }
            unparse(this,(AST *)ppFVar16[-1],bVar11);
            bVar11 = false;
            fodder_fill(this->o,(Fodder *)ppFVar16,false,false,false);
            lVar15 = (long)(ppFVar16 + 3);
            ppFVar16 = ppFVar16 + 0xb;
          } while (lVar15 != lVar9);
        }
        if (*(char *)(lVar7 + 0xb8) != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(this->o,",",1);
        }
        fodder_fill(this->o,(Fodder *)(lVar7 + 0xc0),false,false,false);
        std::__ostream_insert<char,std::char_traits<char>>(this->o,")",1);
        if (*(char *)(lVar7 + 0xf0) != '\x01') {
          return;
        }
        fodder_fill(this->o,(Fodder *)(lVar7 + 0xd8),true,true,false);
        poVar8 = this->o;
        pcVar13 = "tailstrict";
        lVar7 = 10;
        goto LAB_001f92be;
      }
      if (ast_ == (AST *)0x0) {
        auVar21._4_8_ = 0;
        auVar21._0_4_ = auVar20._8_4_;
        auVar21 = auVar21 << 0x40;
      }
      else {
        auVar21 = __dynamic_cast(ast_,&AST::typeinfo,&ApplyBrace::typeinfo);
      }
      lVar7 = auVar21._0_8_;
      if (lVar7 == 0) break;
      unparse(this,*(AST **)(lVar7 + 0x80),bVar11);
      ast_ = *(AST **)(lVar7 + 0x88);
      space_before = true;
    }
    if (ast_ == (AST *)0x0) {
      auVar22._4_8_ = 0;
      auVar22._0_4_ = auVar21._8_4_;
      auVar22 = auVar22 << 0x40;
    }
    else {
      auVar22 = __dynamic_cast(ast_,&AST::typeinfo,&Array::typeinfo);
    }
    lVar7 = auVar22._0_8_;
    if (lVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(this->o,"[",1);
      puVar17 = *(undefined8 **)(lVar7 + 0x80);
      puVar2 = *(undefined8 **)(lVar7 + 0x88);
      if (puVar17 != puVar2) {
        bVar11 = true;
        do {
          if (!bVar11) {
            local_58._M_dataplus._M_p._0_1_ = 0x2c;
            std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_58,1);
          }
          unparse(this,(AST *)*puVar17,(bool)((~bVar11 | (this->opts).padArrays) & 1));
          bVar11 = false;
          fodder_fill(this->o,(Fodder *)(puVar17 + 1),false,false,false);
          puVar17 = puVar17 + 4;
        } while (puVar17 != puVar2);
      }
      if (*(char *)(lVar7 + 0x98) != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(this->o,",",1);
      }
      fodder_fill(this->o,(Fodder *)(lVar7 + 0xa0),
                  *(long *)(lVar7 + 0x88) != *(long *)(lVar7 + 0x80),(this->opts).padArrays,false);
      poVar8 = this->o;
      pcVar13 = "]";
      goto LAB_001f92b9;
    }
    if (ast_ == (AST *)0x0) {
      auVar23._4_8_ = 0;
      auVar23._0_4_ = auVar22._8_4_;
      auVar23 = auVar23 << 0x40;
    }
    else {
      auVar23 = __dynamic_cast(ast_,&AST::typeinfo,&ArrayComprehension::typeinfo);
    }
    lVar7 = auVar23._0_8_;
    if (lVar7 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(this->o,"[",1);
      unparse(this,*(AST **)(lVar7 + 0x80),(this->opts).padArrays);
      fodder_fill(this->o,(Fodder *)(lVar7 + 0x88),false,false,false);
      if (*(char *)(lVar7 + 0xa0) == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>(this->o,",",1);
      }
      unparseSpecs(this,(vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                         *)(lVar7 + 0xa8));
      pFVar18 = (Fodder *)(lVar7 + 0xc0);
      bVar11 = (this->opts).padArrays;
      poVar8 = this->o;
      bVar19 = true;
      goto LAB_001f9352;
    }
    if (ast_ == (AST *)0x0) {
      auVar24._4_8_ = 0;
      auVar24._0_4_ = auVar23._8_4_;
      auVar24 = auVar24 << 0x40;
    }
    else {
      auVar24 = __dynamic_cast(ast_,&AST::typeinfo,&Assert::typeinfo);
    }
    lVar7 = auVar24._0_8_;
    if (lVar7 == 0) break;
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"assert",6);
    unparse(this,*(AST **)(lVar7 + 0x80),true);
    if (*(long *)(lVar7 + 0xa0) != 0) {
      fodder_fill(this->o,(Fodder *)(lVar7 + 0x88),true,true,false);
      std::__ostream_insert<char,std::char_traits<char>>(this->o,":",1);
      unparse(this,*(AST **)(lVar7 + 0xa0),true);
    }
    fodder_fill(this->o,(Fodder *)(lVar7 + 0xa8),false,false,false);
    poVar8 = this->o;
    lVar9 = 1;
    pcVar13 = ";";
LAB_001f8e9f:
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar13,lVar9);
    ast_ = *(AST **)(lVar7 + 0xc0);
    space_before = true;
  }
  if (ast_ == (AST *)0x0) {
    auVar25._4_8_ = 0;
    auVar25._0_4_ = auVar24._8_4_;
    auVar25 = auVar25 << 0x40;
  }
  else {
    auVar25 = __dynamic_cast(ast_,&AST::typeinfo,&Binary::typeinfo);
  }
  lVar7 = auVar25._0_8_;
  if (lVar7 != 0) {
    unparse(this,*(AST **)(lVar7 + 0x80),bVar11);
    fodder_fill(this->o,(Fodder *)(lVar7 + 0x88),true,true,false);
    poVar8 = this->o;
    bop_string_abi_cxx11_(&local_58,(internal *)(ulong)*(uint *)(lVar7 + 0xa0),bop);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,local_58._M_dataplus._M_p,local_58._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
    pAVar6 = *(AST **)(lVar7 + 0xa8);
    goto LAB_001f93e1;
  }
  if (ast_ == (AST *)0x0) {
    auVar26._4_8_ = 0;
    auVar26._0_4_ = auVar25._8_4_;
    auVar26 = auVar26 << 0x40;
  }
  else {
    auVar26 = __dynamic_cast(ast_,&AST::typeinfo,&BuiltinFunction::typeinfo);
  }
  lVar7 = auVar26._0_8_;
  if (lVar7 != 0) {
    poVar8 = this->o;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/* builtin ",0xb);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,*(char **)(lVar7 + 0x80),*(long *)(lVar7 + 0x88));
    pcVar13 = " */ null";
    uVar10 = 8;
    goto LAB_001f942f;
  }
  if (ast_ == (AST *)0x0) {
    auVar27._4_8_ = 0;
    auVar27._0_4_ = auVar26._8_4_;
    auVar27 = auVar27 << 0x40;
  }
  else {
    auVar27 = __dynamic_cast(ast_,&AST::typeinfo,&Conditional::typeinfo);
  }
  lVar7 = auVar27._0_8_;
  if (lVar7 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"if",2);
    unparse(this,*(AST **)(lVar7 + 0x80),true);
    fodder_fill(this->o,(Fodder *)(lVar7 + 0x88),true,true,false);
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"then",4);
    lVar9 = *(long *)(lVar7 + 0xc0);
    unparse(this,*(AST **)(lVar7 + 0xa0),true);
    if (lVar9 == 0) {
      return;
    }
    fodder_fill(this->o,(Fodder *)(lVar7 + 0xa8),true,true,false);
    poVar8 = this->o;
    lVar9 = 4;
    pcVar13 = "else";
    goto LAB_001f8e9f;
  }
  if (ast_ == (AST *)0x0) {
    auVar28._4_8_ = 0;
    auVar28._0_4_ = auVar27._8_4_;
    auVar28 = auVar28 << 0x40;
  }
  else {
    lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&Dollar::typeinfo);
    if (lVar7 != 0) {
      poVar8 = this->o;
      pcVar13 = "$";
      goto LAB_001f9364;
    }
    auVar28 = __dynamic_cast(ast_,&AST::typeinfo,&Error::typeinfo);
  }
  lVar7 = auVar28._0_8_;
  if (lVar7 != 0) {
    poVar8 = this->o;
    lVar9 = 5;
    pcVar13 = "error";
LAB_001f8f05:
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar13,lVar9);
    ast_ = *(AST **)(lVar7 + 0x80);
    space_before = true;
    goto LAB_001f8bc8;
  }
  if (ast_ == (AST *)0x0) {
    auVar29._4_8_ = 0;
    auVar29._0_4_ = auVar28._8_4_;
    auVar29 = auVar29 << 0x40;
  }
  else {
    auVar29 = __dynamic_cast(ast_,&AST::typeinfo,&Function::typeinfo);
  }
  lVar7 = auVar29._0_8_;
  if (lVar7 != 0) goto code_r0x001f8f3f;
  if (ast_ == (AST *)0x0) {
    auVar30._4_8_ = 0;
    auVar30._0_4_ = auVar29._8_4_;
    auVar30 = auVar30 << 0x40;
  }
  else {
    auVar30 = __dynamic_cast(ast_,&AST::typeinfo,&Import::typeinfo);
  }
  lVar7 = auVar30._0_8_;
  if (lVar7 != 0) {
    poVar8 = this->o;
    lVar9 = 6;
    pcVar13 = "import";
    goto LAB_001f8f05;
  }
  if (ast_ == (AST *)0x0) {
    auVar31._4_8_ = 0;
    auVar31._0_4_ = auVar30._8_4_;
    auVar31 = auVar31 << 0x40;
  }
  else {
    auVar31 = __dynamic_cast(ast_,&AST::typeinfo,&Importstr::typeinfo);
  }
  lVar7 = auVar31._0_8_;
  if (lVar7 != 0) {
    poVar8 = this->o;
    lVar9 = 9;
    pcVar13 = "importstr";
    goto LAB_001f8f05;
  }
  if (ast_ == (AST *)0x0) {
    auVar32._4_8_ = 0;
    auVar32._0_4_ = auVar31._8_4_;
    auVar32 = auVar32 << 0x40;
  }
  else {
    auVar32 = __dynamic_cast(ast_,&AST::typeinfo,&Importbin::typeinfo);
  }
  lVar7 = auVar32._0_8_;
  if (lVar7 != 0) {
    poVar8 = this->o;
    lVar9 = 9;
    pcVar13 = "importbin";
    goto LAB_001f8f05;
  }
  if (ast_ == (AST *)0x0) {
    auVar33._4_8_ = 0;
    auVar33._0_4_ = auVar32._8_4_;
    auVar33 = auVar33 << 0x40;
  }
  else {
    auVar33 = __dynamic_cast(ast_,&AST::typeinfo,&InSuper::typeinfo);
  }
  lVar7 = auVar33._0_8_;
  if (lVar7 != 0) {
    unparse(this,*(AST **)(lVar7 + 0x80),true);
    fodder_fill(this->o,(Fodder *)(lVar7 + 0x88),true,true,false);
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"in",2);
    fodder_fill(this->o,(Fodder *)(lVar7 + 0xa0),true,true,false);
    poVar8 = this->o;
    pcVar13 = "super";
    uVar10 = 5;
    goto LAB_001f942f;
  }
  if (ast_ == (AST *)0x0) {
    auVar34._4_8_ = 0;
    auVar34._0_4_ = auVar33._8_4_;
    auVar34 = auVar34 << 0x40;
  }
  else {
    auVar34 = __dynamic_cast(ast_,&AST::typeinfo,&Index::typeinfo);
  }
  lVar7 = auVar34._0_8_;
  if (lVar7 == 0) {
    if (ast_ == (AST *)0x0) {
      auVar4._4_8_ = 0;
      auVar4._0_4_ = auVar34._8_4_;
      auVar35 = auVar4 << 0x40;
    }
    else {
      auVar35 = __dynamic_cast(ast_,&AST::typeinfo,&Local::typeinfo);
    }
    local_38 = auVar35._0_8_;
    if (local_38 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(this->o,"local",5);
      lVar7 = *(long *)(local_38 + 0x88);
      if (lVar7 == *(long *)(local_38 + 0x80)) {
        __assert_fail("ast->binds.size() > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                      ,0x1d0,"void jsonnet::internal::Unparser::unparse(const AST *, bool)");
      }
      bVar11 = true;
      ppFVar16 = (pointer *)(*(long *)(local_38 + 0x80) + 0x80);
      do {
        if (!bVar11) {
          std::__ostream_insert<char,std::char_traits<char>>(this->o,",",1);
        }
        fodder_fill(this->o,(Fodder *)(ppFVar16 + -0x10),true,true,false);
        poVar8 = this->o;
        unparse_id_abi_cxx11_(&local_58,(internal *)ppFVar16[-0xd],id_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,local_58._M_dataplus._M_p,local_58._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
        if (*(char *)(ppFVar16 + -8) == '\x01') {
          unparseParams(this,(Fodder *)(ppFVar16 + -7),(ArgParams *)(ppFVar16 + -4),
                        *(bool *)(ppFVar16 + -1),(Fodder *)ppFVar16);
        }
        bVar11 = false;
        fodder_fill(this->o,(Fodder *)(ppFVar16 + -0xc),true,true,false);
        std::__ostream_insert<char,std::char_traits<char>>(this->o,"=",1);
        unparse(this,(AST *)(((Fodder *)(ppFVar16 + -9))->
                            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            )._M_impl.super__Vector_impl_data._M_start,true);
        fodder_fill(this->o,(Fodder *)(ppFVar16 + 3),false,false,false);
        lVar9 = (long)(ppFVar16 + 6);
        ppFVar16 = ppFVar16 + 0x16;
      } while (lVar9 != lVar7);
      std::__ostream_insert<char,std::char_traits<char>>(this->o,";",1);
      pAVar6 = *(AST **)(local_38 + 0x98);
LAB_001f93e1:
      bVar11 = true;
      goto LAB_001f93e9;
    }
    if (ast_ == (AST *)0x0) {
      lVar7 = 0;
    }
    else {
      auVar20 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralBoolean::typeinfo);
      auVar35._8_4_ = auVar20._8_4_;
      auVar35._0_8_ = local_38;
      lVar7 = auVar20._0_8_;
    }
    local_38 = auVar35._0_8_;
    if (lVar7 != 0) {
      poVar8 = this->o;
      pcVar13 = "false";
      if ((ulong)*(byte *)(lVar7 + 0x80) != 0) {
        pcVar13 = "true";
      }
      uVar10 = (ulong)*(byte *)(lVar7 + 0x80) ^ 5;
      goto LAB_001f942f;
    }
    if (ast_ == (AST *)0x0) {
      lVar7 = 0;
    }
    else {
      auVar20 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralNumber::typeinfo);
      auVar35._8_4_ = auVar20._8_4_;
      auVar35._0_8_ = local_38;
      lVar7 = auVar20._0_8_;
    }
    local_38 = auVar35._0_8_;
    if (lVar7 != 0) {
      poVar8 = this->o;
      pcVar13 = *(char **)(lVar7 + 0x88);
      uVar10 = *(ulong *)(lVar7 + 0x90);
      goto LAB_001f942f;
    }
    if (ast_ == (AST *)0x0) {
      lVar7 = 0;
    }
    else {
      auVar20 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralString::typeinfo);
      auVar35._8_4_ = auVar20._8_4_;
      auVar35._0_8_ = local_38;
      lVar7 = auVar20._0_8_;
    }
    local_38 = auVar35._0_8_;
    if (lVar7 != 0) {
      switch(*(undefined4 *)(lVar7 + 0xa0)) {
      case 0:
        std::__ostream_insert<char,std::char_traits<char>>(this->o,"\'",1);
        poVar8 = this->o;
        encode_utf8(&local_58,(UString *)(lVar7 + 0x80));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,local_58._M_dataplus._M_p,local_58._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
LAB_001f9971:
        poVar8 = this->o;
        pcVar13 = "\'";
        break;
      case 1:
        std::__ostream_insert<char,std::char_traits<char>>(this->o,"\"",1);
        poVar8 = this->o;
        encode_utf8(&local_58,(UString *)(lVar7 + 0x80));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,local_58._M_dataplus._M_p,local_58._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,
                          CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                   local_58.field_2._M_local_buf[0]) + 1);
        }
LAB_001f9a17:
        poVar8 = this->o;
        pcVar13 = "\"";
        break;
      case 2:
        std::__ostream_insert<char,std::char_traits<char>>(this->o,"|||",3);
        if (*(int *)(*(long *)(lVar7 + 0x80) + -4 + *(long *)(lVar7 + 0x88) * 4) != 10) {
          std::__ostream_insert<char,std::char_traits<char>>(this->o,"-",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(this->o,"\n",1);
        if (**(int **)(lVar7 + 0x80) != 10) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (this->o,*(char **)(lVar7 + 0xa8),*(long *)(lVar7 + 0xb0));
        }
        pcVar14 = *(char32_t **)(lVar7 + 0x80);
        do {
          if (*pcVar14 != L'\r') {
            if (*pcVar14 == L'\0') goto LAB_001f9c61;
            local_58._M_string_length = 0;
            local_58.field_2._M_local_buf[0] = '\0';
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            encode_utf8(*pcVar14,&local_58);
            std::__ostream_insert<char,std::char_traits<char>>
                      (this->o,local_58._M_dataplus._M_p,local_58._M_string_length);
            if (((*pcVar14 == L'\n') && (pcVar14[1] != L'\0')) && (pcVar14[1] != L'\n')) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (this->o,*(char **)(lVar7 + 0xa8),*(long *)(lVar7 + 0xb0));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,
                              CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                       local_58.field_2._M_local_buf[0]) + 1);
            }
          }
          pcVar14 = pcVar14 + 1;
        } while( true );
      case 3:
        std::__ostream_insert<char,std::char_traits<char>>(this->o,"@\'",2);
        pcVar14 = *(char32_t **)(lVar7 + 0x80);
        do {
          if (*pcVar14 == L'\'') {
            std::__ostream_insert<char,std::char_traits<char>>(this->o,"\'\'",2);
          }
          else {
            if (*pcVar14 == L'\0') goto LAB_001f9971;
            local_58._M_string_length = 0;
            local_58.field_2._M_local_buf[0] = '\0';
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            encode_utf8(*pcVar14,&local_58);
            std::__ostream_insert<char,std::char_traits<char>>
                      (this->o,local_58._M_dataplus._M_p,local_58._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,
                              CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                       local_58.field_2._M_local_buf[0]) + 1);
            }
          }
          pcVar14 = pcVar14 + 1;
        } while( true );
      case 4:
        std::__ostream_insert<char,std::char_traits<char>>(this->o,"@\"",2);
        pcVar14 = *(char32_t **)(lVar7 + 0x80);
        do {
          if (*pcVar14 == L'\"') {
            std::__ostream_insert<char,std::char_traits<char>>(this->o,"\"\"",2);
          }
          else {
            if (*pcVar14 == L'\0') goto LAB_001f9a17;
            local_58._M_string_length = 0;
            local_58.field_2._M_local_buf[0] = '\0';
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            encode_utf8(*pcVar14,&local_58);
            std::__ostream_insert<char,std::char_traits<char>>
                      (this->o,local_58._M_dataplus._M_p,local_58._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,
                              CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                       local_58.field_2._M_local_buf[0]) + 1);
            }
          }
          pcVar14 = pcVar14 + 1;
        } while( true );
      case 5:
        __assert_fail("ast->tokenKind != LiteralString::RAW_DESUGARED",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                      ,0x1ed,"void jsonnet::internal::Unparser::unparse(const AST *, bool)");
      default:
        goto switchD_001f991a_default;
      }
LAB_001f92b9:
      lVar7 = 1;
      goto LAB_001f92be;
    }
    if (ast_ != (AST *)0x0) {
      lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralNull::typeinfo);
      if (lVar7 == 0) {
        auVar20 = __dynamic_cast(ast_,&AST::typeinfo,&Object::typeinfo);
        auVar35._8_4_ = auVar20._8_4_;
        auVar35._0_8_ = local_38;
        lVar7 = auVar20._0_8_;
        goto LAB_001f9ccf;
      }
      poVar8 = this->o;
      pcVar13 = "null";
LAB_001f99b0:
      uVar10 = 4;
      goto LAB_001f942f;
    }
    lVar7 = 0;
LAB_001f9ccf:
    local_38 = auVar35._0_8_;
    if (lVar7 == 0) {
      if (ast_ == (AST *)0x0) {
        auVar5._4_8_ = 0;
        auVar5._0_4_ = auVar35._8_4_;
        auVar36 = auVar5 << 0x40;
      }
      else {
        auVar36 = __dynamic_cast(ast_,&AST::typeinfo,&DesugaredObject::typeinfo);
      }
      local_38 = auVar36._0_8_;
      if (local_38 == 0) {
        if (ast_ == (AST *)0x0) {
          lVar7 = 0;
        }
        else {
          auVar20 = __dynamic_cast(ast_,&AST::typeinfo,&ObjectComprehension::typeinfo);
          auVar36._8_4_ = auVar20._8_4_;
          auVar36._0_8_ = local_38;
          lVar7 = auVar20._0_8_;
        }
        local_38 = auVar36._0_8_;
        if (lVar7 == 0) {
          if (ast_ == (AST *)0x0) {
            lVar7 = 0;
          }
          else {
            auVar20 = __dynamic_cast(ast_,&AST::typeinfo,&ObjectComprehensionSimple::typeinfo);
            auVar36._8_4_ = auVar20._8_4_;
            auVar36._0_8_ = local_38;
            lVar7 = auVar20._0_8_;
          }
          local_38 = auVar36._0_8_;
          if (lVar7 == 0) {
            if (ast_ == (AST *)0x0) {
              lVar7 = 0;
            }
            else {
              auVar20 = __dynamic_cast(ast_,&AST::typeinfo,&Parens::typeinfo);
              auVar36._8_4_ = auVar20._8_4_;
              auVar36._0_8_ = local_38;
              lVar7 = auVar20._0_8_;
            }
            local_38 = auVar36._0_8_;
            if (lVar7 == 0) {
              if (ast_ == (AST *)0x0) {
                lVar7 = 0;
              }
              else {
                lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&Self::typeinfo);
                if (lVar7 != 0) {
                  poVar8 = this->o;
                  pcVar13 = "self";
                  goto LAB_001f99b0;
                }
                auVar20 = __dynamic_cast(ast_,&AST::typeinfo,&SuperIndex::typeinfo);
                auVar36._8_4_ = auVar20._8_4_;
                auVar36._0_8_ = local_38;
                lVar7 = auVar20._0_8_;
              }
              local_38 = auVar36._0_8_;
              if (lVar7 == 0) {
                if (ast_ == (AST *)0x0) {
                  lVar7 = 0;
                }
                else {
                  auVar20 = __dynamic_cast(ast_,&AST::typeinfo,&Unary::typeinfo,0);
                  auVar36._8_4_ = auVar20._8_4_;
                  auVar36._0_8_ = local_38;
                  lVar7 = auVar20._0_8_;
                }
                local_38 = auVar36._0_8_;
                if (lVar7 != 0) {
                  poVar8 = this->o;
                  uop_string_abi_cxx11_
                            (&local_58,(internal *)(ulong)*(uint *)(lVar7 + 0x80),auVar36._8_4_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8,local_58._M_dataplus._M_p,local_58._M_string_length);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_58._M_dataplus._M_p != &local_58.field_2) {
                    operator_delete(local_58._M_dataplus._M_p,
                                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                             local_58.field_2._M_local_buf[0]) + 1);
                  }
                  pAVar6 = *(AST **)(lVar7 + 0x88);
                  bVar11 = false;
LAB_001f93e9:
                  unparse(this,pAVar6,bVar11);
                  return;
                }
                if (ast_ == (AST *)0x0) {
                  lVar7 = 0;
                }
                else {
                  lVar7 = __dynamic_cast(ast_,&AST::typeinfo,&Var::typeinfo,0);
                }
                if (lVar7 == 0) {
                  poVar8 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unknown AST: ");
                  poVar8 = (ostream *)std::ostream::operator<<(poVar8,ast_);
                  std::endl<char,std::char_traits<char>>(poVar8);
                  abort();
                }
                poVar8 = this->o;
                encode_utf8(&local_58,*(UString **)(lVar7 + 0x80));
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,local_58._M_dataplus._M_p,local_58._M_string_length);
LAB_001f95a3:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p == &local_58.field_2) {
                  return;
                }
                operator_delete(local_58._M_dataplus._M_p,
                                CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                         local_58.field_2._M_local_buf[0]) + 1);
                return;
              }
              std::__ostream_insert<char,std::char_traits<char>>(this->o,"super",5);
              fodder_fill(this->o,(Fodder *)(lVar7 + 0x80),false,false,false);
              if (*(long *)(lVar7 + 0xb8) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>(this->o,".",1);
                fodder_fill(this->o,(Fodder *)(lVar7 + 0xa0),false,false,false);
                poVar8 = this->o;
                unparse_id_abi_cxx11_(&local_58,*(internal **)(lVar7 + 0xb8),id_03);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,local_58._M_dataplus._M_p,local_58._M_string_length);
                goto LAB_001f95a3;
              }
              std::__ostream_insert<char,std::char_traits<char>>(this->o,"[",1);
              unparse(this,*(AST **)(lVar7 + 0x98),false);
              pFVar18 = (Fodder *)(lVar7 + 0xa0);
              goto LAB_001f96c8;
            }
            std::__ostream_insert<char,std::char_traits<char>>(this->o,"(",1);
            unparse(this,*(AST **)(lVar7 + 0x80),false);
            fodder_fill(this->o,(Fodder *)(lVar7 + 0x88),false,false,false);
            poVar8 = this->o;
            pcVar13 = ")";
            goto LAB_001f9364;
          }
          std::__ostream_insert<char,std::char_traits<char>>(this->o,"{[",2);
          unparse(this,*(AST **)(lVar7 + 0x80),false);
          std::__ostream_insert<char,std::char_traits<char>>(this->o,"]:",2);
          unparse(this,*(AST **)(lVar7 + 0x88),true);
          poVar8 = this->o;
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," for ",5);
          unparse_id_abi_cxx11_(&local_58,*(internal **)(lVar7 + 0x90),id_02);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_58._M_dataplus._M_p,local_58._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," in",3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
          unparse(this,*(AST **)(lVar7 + 0x98),true);
          poVar8 = this->o;
          pcVar13 = "}";
          goto LAB_001f92b9;
        }
        std::__ostream_insert<char,std::char_traits<char>>(this->o,"{",1);
        unparseFields(this,(ObjectFields *)(lVar7 + 0x80),(this->opts).padObjects);
        if (*(char *)(lVar7 + 0x98) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>(this->o,",",1);
        }
        unparseSpecs(this,(vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                           *)(lVar7 + 0xa0));
        pFVar18 = (Fodder *)(lVar7 + 0xb8);
        bVar11 = (this->opts).padObjects;
        poVar8 = this->o;
        bVar19 = true;
        goto LAB_001f9d3a;
      }
      std::__ostream_insert<char,std::char_traits<char>>(this->o,"{",1);
      puVar17 = (undefined8 *)(local_38 + 0x80);
      for (puVar2 = *(undefined8 **)(local_38 + 0x80); puVar2 != puVar17;
          puVar2 = (undefined8 *)*puVar2) {
        pAVar6 = (AST *)puVar2[2];
        std::__ostream_insert<char,std::char_traits<char>>(this->o,"assert",6);
        unparse(this,pAVar6,true);
        std::__ostream_insert<char,std::char_traits<char>>(this->o,",",1);
      }
      piVar3 = *(int **)(local_38 + 0xa0);
      for (piVar12 = *(int **)(local_38 + 0x98); piVar12 != piVar3; piVar12 = piVar12 + 6) {
        std::__ostream_insert<char,std::char_traits<char>>(this->o,"[",1);
        unparse(this,*(AST **)(piVar12 + 2),false);
        std::__ostream_insert<char,std::char_traits<char>>(this->o,"]",1);
        iVar1 = *piVar12;
        if (iVar1 == 0) {
          poVar8 = this->o;
          lVar7 = 2;
          pcVar13 = "::";
LAB_001f9ea1:
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar13,lVar7);
        }
        else {
          if (iVar1 == 2) {
            poVar8 = this->o;
            lVar7 = 3;
            pcVar13 = ":::";
            goto LAB_001f9ea1;
          }
          if (iVar1 == 1) {
            poVar8 = this->o;
            lVar7 = 1;
            pcVar13 = ":";
            goto LAB_001f9ea1;
          }
        }
        unparse(this,*(AST **)(piVar12 + 4),true);
        std::__ostream_insert<char,std::char_traits<char>>(this->o,",",1);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(this->o,"{",1);
      unparseFields(this,(ObjectFields *)(lVar7 + 0x80),(this->opts).padObjects);
      if (*(char *)(lVar7 + 0x98) == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>(this->o,",",1);
      }
      bVar19 = *(long *)(lVar7 + 0x88) != *(long *)(lVar7 + 0x80);
      pFVar18 = (Fodder *)(lVar7 + 0xa0);
      bVar11 = (this->opts).padObjects;
      poVar8 = this->o;
LAB_001f9d3a:
      fodder_fill(poVar8,pFVar18,bVar19,bVar11,false);
    }
    poVar8 = this->o;
    pcVar13 = "}";
  }
  else {
    unparse(this,*(AST **)(lVar7 + 0x80),bVar11);
    fodder_fill(this->o,(Fodder *)(lVar7 + 0x88),false,false,false);
    if (*(long *)(lVar7 + 0x108) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(this->o,".",1);
      fodder_fill(this->o,(Fodder *)(lVar7 + 0xf0),false,false,false);
      poVar8 = this->o;
      unparse_id_abi_cxx11_(&local_58,*(internal **)(lVar7 + 0x108),id_00);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,local_58._M_dataplus._M_p,local_58._M_string_length);
      goto LAB_001f95a3;
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"[",1);
    pAVar6 = *(AST **)(lVar7 + 0xa8);
    if (*(char *)(lVar7 + 0xa0) == '\x01') {
      if (pAVar6 != (AST *)0x0) {
        unparse(this,pAVar6,false);
      }
      fodder_fill(this->o,(Fodder *)(lVar7 + 0xb0),false,false,false);
      std::__ostream_insert<char,std::char_traits<char>>(this->o,":",1);
      if (*(AST **)(lVar7 + 200) != (AST *)0x0) {
        unparse(this,*(AST **)(lVar7 + 200),false);
      }
      if ((*(long *)(lVar7 + 0xe8) != 0) || (*(long *)(lVar7 + 0xd8) != *(long *)(lVar7 + 0xd0))) {
        fodder_fill(this->o,(Fodder *)(lVar7 + 0xd0),false,false,false);
        std::__ostream_insert<char,std::char_traits<char>>(this->o,":",1);
        pAVar6 = *(AST **)(lVar7 + 0xe8);
        if (pAVar6 != (AST *)0x0) goto LAB_001f96b7;
      }
    }
    else {
LAB_001f96b7:
      unparse(this,pAVar6,false);
    }
    pFVar18 = (Fodder *)(lVar7 + 0xf0);
LAB_001f96c8:
    poVar8 = this->o;
    bVar19 = false;
    bVar11 = false;
LAB_001f9352:
    fodder_fill(poVar8,pFVar18,bVar19,bVar11,false);
    poVar8 = this->o;
    pcVar13 = "]";
  }
LAB_001f9364:
  uVar10 = 1;
LAB_001f942f:
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar13,uVar10);
  return;
code_r0x001f8f3f:
  std::__ostream_insert<char,std::char_traits<char>>(this->o,"function",8);
  unparseParams(this,(Fodder *)(lVar7 + 0x80),(ArgParams *)(lVar7 + 0x98),*(bool *)(lVar7 + 0xb0),
                (Fodder *)(lVar7 + 0xb8));
  ast_ = *(AST **)(lVar7 + 0xd0);
  space_before = true;
  goto LAB_001f8bc8;
LAB_001f9c61:
  if (*(int *)(*(long *)(lVar7 + 0x80) + -4 + *(long *)(lVar7 + 0x88) * 4) != 10) {
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"\n",1);
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->o,*(char **)(lVar7 + 200),*(long *)(lVar7 + 0xd0));
  pcVar13 = "|||";
  lVar7 = 3;
LAB_001f92be:
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar13,lVar7);
switchD_001f991a_default:
  return;
}

Assistant:

void unparse(const AST *ast_, bool space_before)
    {
        bool separate_token = !left_recursive(ast_);

        fill(ast_->openFodder, space_before, separate_token);

        if (auto *ast = dynamic_cast<const Apply *>(ast_)) {
            unparse(ast->target, space_before);
            fill(ast->fodderL, false, false);
            o << "(";
            bool first = true;
            for (const auto &arg : ast->args) {
                if (!first)
                    o << ',';
                bool space = !first;
                if (arg.id != nullptr) {
                    fill(arg.idFodder, space, true);
                    o << unparse_id(arg.id);
                    space = false;
                    o << "=";
                }
                unparse(arg.expr, space);
                fill(arg.commaFodder, false, false);
                first = false;
            }
            if (ast->trailingComma)
                o << ",";
            fill(ast->fodderR, false, false);
            o << ")";
            if (ast->tailstrict) {
                fill(ast->tailstrictFodder, true, true);
                o << "tailstrict";
            }

        } else if (auto *ast = dynamic_cast<const ApplyBrace *>(ast_)) {
            unparse(ast->left, space_before);
            unparse(ast->right, true);

        } else if (auto *ast = dynamic_cast<const Array *>(ast_)) {
            o << "[";
            bool first = true;
            for (const auto &element : ast->elements) {
                if (!first)
                    o << ',';
                unparse(element.expr, !first || opts.padArrays);
                fill(element.commaFodder, false, false);
                first = false;
            }
            if (ast->trailingComma)
                o << ",";
            fill(ast->closeFodder, ast->elements.size() > 0, opts.padArrays);
            o << "]";

        } else if (auto *ast = dynamic_cast<const ArrayComprehension *>(ast_)) {
            o << "[";
            unparse(ast->body, opts.padArrays);
            fill(ast->commaFodder, false, false);
            if (ast->trailingComma)
                o << ",";
            unparseSpecs(ast->specs);
            fill(ast->closeFodder, true, opts.padArrays);
            o << "]";

        } else if (auto *ast = dynamic_cast<const Assert *>(ast_)) {
            o << "assert";
            unparse(ast->cond, true);
            if (ast->message != nullptr) {
                fill(ast->colonFodder, true, true);
                o << ":";
                unparse(ast->message, true);
            }
            fill(ast->semicolonFodder, false, false);
            o << ";";
            unparse(ast->rest, true);

        } else if (auto *ast = dynamic_cast<const Binary *>(ast_)) {
            unparse(ast->left, space_before);
            fill(ast->opFodder, true, true);
            o << bop_string(ast->op);
            // The - 1 is for left associativity.
            unparse(ast->right, true);

        } else if (auto *ast = dynamic_cast<const BuiltinFunction *>(ast_)) {
            o << "/* builtin " << ast->name << " */ null";

        } else if (auto *ast = dynamic_cast<const Conditional *>(ast_)) {
            o << "if";
            unparse(ast->cond, true);
            fill(ast->thenFodder, true, true);
            o << "then";
            if (ast->branchFalse != nullptr) {
                unparse(ast->branchTrue, true);
                fill(ast->elseFodder, true, true);
                o << "else";
                unparse(ast->branchFalse, true);
            } else {
                unparse(ast->branchTrue, true);
            }

        } else if (dynamic_cast<const Dollar *>(ast_)) {
            o << "$";

        } else if (auto *ast = dynamic_cast<const Error *>(ast_)) {
            o << "error";
            unparse(ast->expr, true);

        } else if (auto *ast = dynamic_cast<const Function *>(ast_)) {
            o << "function";
            unparseParams(
                ast->parenLeftFodder, ast->params, ast->trailingComma, ast->parenRightFodder);
            unparse(ast->body, true);

        } else if (auto *ast = dynamic_cast<const Import *>(ast_)) {
            o << "import";
            unparse(ast->file, true);

        } else if (auto *ast = dynamic_cast<const Importstr *>(ast_)) {
            o << "importstr";
            unparse(ast->file, true);

        } else if (auto *ast = dynamic_cast<const Importbin *>(ast_)) {
            o << "importbin";
            unparse(ast->file, true);

        } else if (auto *ast = dynamic_cast<const InSuper *>(ast_)) {
            unparse(ast->element, true);
            fill(ast->inFodder, true, true);
            o << "in";
            fill(ast->superFodder, true, true);
            o << "super";

        } else if (auto *ast = dynamic_cast<const Index *>(ast_)) {
            unparse(ast->target, space_before);
            fill(ast->dotFodder, false, false);
            if (ast->id != nullptr) {
                o << ".";
                fill(ast->idFodder, false, false);
                o << unparse_id(ast->id);
            } else {
                o << "[";
                if (ast->isSlice) {
                    if (ast->index != nullptr) {
                        unparse(ast->index, false);
                    }
                    fill(ast->endColonFodder, false, false);
                    o << ":";
                    if (ast->end != nullptr) {
                        unparse(ast->end, false);
                    }
                    if (ast->step != nullptr || ast->stepColonFodder.size() > 0) {
                        fill(ast->stepColonFodder, false, false);
                        o << ":";
                        if (ast->step != nullptr) {
                            unparse(ast->step, false);
                        }
                    }
                } else {
                    unparse(ast->index, false);
                }
                fill(ast->idFodder, false, false);
                o << "]";
            }

        } else if (auto *ast = dynamic_cast<const Local *>(ast_)) {
            o << "local";
            assert(ast->binds.size() > 0);
            bool first = true;
            for (const auto &bind : ast->binds) {
                if (!first)
                    o << ",";
                first = false;
                fill(bind.varFodder, true, true);
                o << unparse_id(bind.var);
                if (bind.functionSugar) {
                    unparseParams(bind.parenLeftFodder,
                                  bind.params,
                                  bind.trailingComma,
                                  bind.parenRightFodder);
                }
                fill(bind.opFodder, true, true);
                o << "=";
                unparse(bind.body, true);
                fill(bind.closeFodder, false, false);
            }
            o << ";";
            unparse(ast->body, true);

        } else if (auto *ast = dynamic_cast<const LiteralBoolean *>(ast_)) {
            o << (ast->value ? "true" : "false");

        } else if (auto *ast = dynamic_cast<const LiteralNumber *>(ast_)) {
            o << ast->originalString;

        } else if (auto *ast = dynamic_cast<const LiteralString *>(ast_)) {
            assert(ast->tokenKind != LiteralString::RAW_DESUGARED);
            if (ast->tokenKind == LiteralString::DOUBLE) {
                o << "\"";
                o << encode_utf8(ast->value);
                o << "\"";
            } else if (ast->tokenKind == LiteralString::SINGLE) {
                o << "'";
                o << encode_utf8(ast->value);
                o << "'";
            } else if (ast->tokenKind == LiteralString::BLOCK) {
                o << "|||";
                if (ast->value.back() != U'\n') {
                    o << "-";
                }
                o << "\n";
                if (ast->value.c_str()[0] != U'\n')
                    o << ast->blockIndent;
                for (const char32_t *cp = ast->value.c_str(); *cp != U'\0'; ++cp) {
                    // Formatter always outputs in unix mode.
                    if (*cp == '\r') continue;
                    std::string utf8;
                    encode_utf8(*cp, utf8);
                    o << utf8;
                    if (*cp == U'\n' && *(cp + 1) != U'\n' && *(cp + 1) != U'\0') {
                        o << ast->blockIndent;
                    }
                }
                if (ast->value.back() != U'\n') {
                    o << "\n";
                }
                o << ast->blockTermIndent << "|||";
            } else if (ast->tokenKind == LiteralString::VERBATIM_DOUBLE) {
                o << "@\"";
                for (const char32_t *cp = ast->value.c_str(); *cp != U'\0'; ++cp) {
                    if (*cp == U'"') {
                        o << "\"\"";
                    } else {
                        std::string utf8;
                        encode_utf8(*cp, utf8);
                        o << utf8;
                    }
                }
                o << "\"";
            } else if (ast->tokenKind == LiteralString::VERBATIM_SINGLE) {
                o << "@'";
                for (const char32_t *cp = ast->value.c_str(); *cp != U'\0'; ++cp) {
                    if (*cp == U'\'') {
                        o << "''";
                    } else {
                        std::string utf8;
                        encode_utf8(*cp, utf8);
                        o << utf8;
                    }
                }
                o << "'";
            }

        } else if (dynamic_cast<const LiteralNull *>(ast_)) {
            o << "null";

        } else if (auto *ast = dynamic_cast<const Object *>(ast_)) {
            o << "{";
            unparseFields(ast->fields, opts.padObjects);
            if (ast->trailingComma)
                o << ",";
            fill(ast->closeFodder, ast->fields.size() > 0, opts.padObjects);
            o << "}";

        } else if (auto *ast = dynamic_cast<const DesugaredObject *>(ast_)) {
            o << "{";
            for (AST *assert : ast->asserts) {
                o << "assert";
                unparse(assert, true);
                o << ",";
            }
            for (auto &field : ast->fields) {
                o << "[";
                unparse(field.name, false);
                o << "]";
                switch (field.hide) {
                    case ObjectField::INHERIT: o << ":"; break;
                    case ObjectField::HIDDEN: o << "::"; break;
                    case ObjectField::VISIBLE: o << ":::"; break;
                }
                unparse(field.body, true);
                o << ",";
            }
            o << "}";

        } else if (auto *ast = dynamic_cast<const ObjectComprehension *>(ast_)) {
            o << "{";
            unparseFields(ast->fields, opts.padObjects);
            if (ast->trailingComma)
                o << ",";
            unparseSpecs(ast->specs);
            fill(ast->closeFodder, true, opts.padObjects);
            o << "}";

        } else if (auto *ast = dynamic_cast<const ObjectComprehensionSimple *>(ast_)) {
            o << "{[";
            unparse(ast->field, false);
            o << "]:";
            unparse(ast->value, true);
            o << " for " << unparse_id(ast->id) << " in";
            unparse(ast->array, true);
            o << "}";

        } else if (auto *ast = dynamic_cast<const Parens *>(ast_)) {
            o << "(";
            unparse(ast->expr, false);
            fill(ast->closeFodder, false, false);
            o << ")";

        } else if (dynamic_cast<const Self *>(ast_)) {
            o << "self";

        } else if (auto *ast = dynamic_cast<const SuperIndex *>(ast_)) {
            o << "super";
            fill(ast->dotFodder, false, false);
            if (ast->id != nullptr) {
                o << ".";
                fill(ast->idFodder, false, false);
                o << unparse_id(ast->id);
            } else {
                o << "[";
                unparse(ast->index, false);
                fill(ast->idFodder, false, false);
                o << "]";
            }

        } else if (auto *ast = dynamic_cast<const Unary *>(ast_)) {
            o << uop_string(ast->op);
            unparse(ast->expr, false);

        } else if (auto *ast = dynamic_cast<const Var *>(ast_)) {
            o << encode_utf8(ast->id->name);

        } else {
            std::cerr << "INTERNAL ERROR: Unknown AST: " << ast_ << std::endl;
            std::abort();
        }
    }